

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osstzprs.c
# Opt level: O1

int oss_parse_posix_tz(os_tzinfo_t *info,char *tz,size_t len,int west_is_positive)

{
  char cVar1;
  size_t sVar2;
  ushort **ppuVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  int dst_ofs;
  int std_ofs;
  os_tzrule_t dst_end;
  os_tzrule_t dst_start;
  size_t local_90;
  int local_88;
  int local_84;
  char *local_80;
  long local_78;
  char *local_70;
  os_tzrule_t local_68;
  os_tzrule_t local_48;
  
  local_84 = 0;
  local_88 = 0;
  local_48.jday = 0;
  local_48.yday = 0;
  local_48.month = 0;
  local_48.week = 0;
  local_48.day = 0;
  local_48.time = 0;
  local_68.jday = 0;
  local_68.yday = 0;
  local_68.month = 0;
  local_68.week = 0;
  local_68.day = 0;
  local_68.time = 0;
  if (tz == (char *)0x0) {
    return 0;
  }
  bVar9 = len == 0;
  if (bVar9) {
    return 0;
  }
  local_90 = len;
  ppuVar3 = __ctype_b_loc();
  cVar1 = *tz;
  while ((*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) != 0) {
    bVar9 = len == 1;
    if (bVar9) {
      return 0;
    }
    cVar1 = tz[1];
    tz = tz + 1;
    len = len - 1;
  }
  if (bVar9) {
    return 0;
  }
  local_90 = len;
  ppuVar3 = __ctype_b_loc();
  pcVar6 = tz + local_90;
  pcVar5 = tz;
  do {
    if ((*(byte *)((long)*ppuVar3 + (long)*pcVar5 * 2 + 1) & 4) == 0) goto LAB_00122822;
    pcVar5 = pcVar5 + 1;
    local_90 = local_90 - 1;
  } while (local_90 != 0);
  local_90 = 0;
  pcVar5 = pcVar6;
LAB_00122822:
  if (pcVar5 == tz) {
    return 0;
  }
  local_80 = parse_offset(&local_84,pcVar5,&local_90);
  if (local_80 == pcVar5) {
    return 0;
  }
  if (west_is_positive != 0) {
    local_84 = -local_84;
  }
  pcVar6 = local_80;
  if (local_90 != 0) {
    if (local_80 == (char *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      ppuVar3 = __ctype_b_loc();
      pcVar4 = local_80 + local_90;
      do {
        if ((*(byte *)((long)*ppuVar3 + (long)*pcVar6 * 2 + 1) & 4) == 0) goto LAB_00122898;
        pcVar6 = pcVar6 + 1;
        local_90 = local_90 - 1;
      } while (local_90 != 0);
      local_90 = 0;
      pcVar6 = pcVar4;
    }
LAB_00122898:
    local_78 = (long)pcVar6 - (long)local_80;
    if (local_78 != 0) {
      local_70 = pcVar6;
      pcVar6 = parse_offset(&local_88,pcVar6,&local_90);
      if (pcVar6 == local_70) {
        local_88 = local_84 + 0xe10;
      }
      else if (west_is_positive != 0) {
        local_88 = -local_88;
      }
      goto LAB_001228f3;
    }
  }
  local_88 = local_84;
  local_78 = 0;
  local_80 = (char *)0x0;
LAB_001228f3:
  if ((local_90 != 0) && (*pcVar6 == ',')) {
    local_90 = local_90 - 1;
    pcVar4 = parse_dst_rule(&local_48,pcVar6 + 1,&local_90);
    if (pcVar4 == pcVar6 + 1) {
      return 0;
    }
    if (local_90 == 0) {
      return 0;
    }
    if (*pcVar4 != ',') {
      return 0;
    }
    local_90 = local_90 - 1;
    pcVar6 = parse_dst_rule(&local_68,pcVar4 + 1,&local_90);
    if (pcVar6 == pcVar4 + 1) {
      return 0;
    }
  }
  sVar2 = local_90;
  if (local_90 != 0) {
    ppuVar3 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar3 + (long)*pcVar6 * 2 + 1) & 0x20) == 0) {
        if (sVar2 != 0) {
          return 0;
        }
        break;
      }
      pcVar6 = pcVar6 + 1;
    } while (sVar2 != 0);
  }
  (info->dst_end).week = 0;
  (info->dst_end).day = 0;
  *(undefined8 *)&(info->dst_end).time = 0;
  (info->dst_end).jday = 0;
  (info->dst_end).yday = 0;
  (info->dst_end).month = 0;
  (info->dst_end).week = 0;
  (info->dst_start).month = 0;
  (info->dst_start).week = 0;
  (info->dst_start).day = 0;
  (info->dst_start).time = 0;
  info->dst_abbr[8] = '\0';
  info->dst_abbr[9] = '\0';
  info->dst_abbr[10] = '\0';
  info->dst_abbr[0xb] = '\0';
  info->dst_abbr[0xc] = '\0';
  info->dst_abbr[0xd] = '\0';
  info->dst_abbr[0xe] = '\0';
  info->dst_abbr[0xf] = '\0';
  (info->dst_start).jday = 0;
  (info->dst_start).yday = 0;
  info->std_abbr[8] = '\0';
  info->std_abbr[9] = '\0';
  info->std_abbr[10] = '\0';
  info->std_abbr[0xb] = '\0';
  info->std_abbr[0xc] = '\0';
  info->std_abbr[0xd] = '\0';
  info->std_abbr[0xe] = '\0';
  info->std_abbr[0xf] = '\0';
  info->dst_abbr[0] = '\0';
  info->dst_abbr[1] = '\0';
  info->dst_abbr[2] = '\0';
  info->dst_abbr[3] = '\0';
  info->dst_abbr[4] = '\0';
  info->dst_abbr[5] = '\0';
  info->dst_abbr[6] = '\0';
  info->dst_abbr[7] = '\0';
  info->std_ofs = 0;
  info->dst_ofs = 0;
  info->std_abbr[0] = '\0';
  info->std_abbr[1] = '\0';
  info->std_abbr[2] = '\0';
  info->std_abbr[3] = '\0';
  info->std_abbr[4] = '\0';
  info->std_abbr[5] = '\0';
  info->std_abbr[6] = '\0';
  info->std_abbr[7] = '\0';
  info->std_ofs = local_84;
  info->dst_ofs = local_88;
  pcVar6 = info->std_abbr;
  if (pcVar5 != tz) {
    lVar7 = 0;
    ppuVar3 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar3 + (long)tz[lVar7] * 2 + 1) & 4) == 0) break;
      pcVar6[lVar7] = tz[lVar7];
      lVar7 = lVar7 + 1;
    } while ((long)pcVar5 - (long)tz != lVar7);
    pcVar6 = pcVar6 + lVar7;
  }
  lVar7 = local_78;
  pcVar5 = local_80;
  *pcVar6 = '\0';
  pcVar6 = info->dst_abbr;
  if ((local_78 != 0) && (local_80 != (char *)0x0)) {
    lVar8 = 0;
    ppuVar3 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar3 + (long)pcVar5[lVar8] * 2 + 1) & 4) == 0) break;
      pcVar6[lVar8] = pcVar5[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
    pcVar6 = pcVar6 + lVar8;
  }
  *pcVar6 = '\0';
  (info->dst_start).day = local_48.day;
  (info->dst_start).time = local_48.time;
  (info->dst_start).jday = local_48.jday;
  (info->dst_start).yday = local_48.yday;
  (info->dst_start).month = local_48.month;
  (info->dst_start).week = local_48.week;
  (info->dst_end).jday = local_68.jday;
  (info->dst_end).yday = local_68.yday;
  (info->dst_end).month = local_68.month;
  (info->dst_end).week = local_68.week;
  (info->dst_end).day = local_68.day;
  (info->dst_end).time = local_68.time;
  return 1;
}

Assistant:

int oss_parse_posix_tz(struct os_tzinfo_t *info, const char *tz, size_t len,
                       int west_is_positive)
{
    const char *p;
    const char *std_name = 0, *dst_name = 0;
    size_t std_name_len = 0, dst_name_len = 0;
    int std_ofs = 0, dst_ofs = 0;
    struct os_tzrule_t dst_start, dst_end;

    /* clear the daylight savings start/end dates */
    memset(&dst_start, 0, sizeof(dst_start));
    memset(&dst_end, 0, sizeof(dst_end));

    /* if there's no TZ string, return failure */
    if (tz == 0)
        return FALSE;

    /* skip leading spaces, just in case; if that leaves nothing, fail */
    for ( ; len != 0 && isspace(*tz) ; ++tz, --len) ;
    if (len == 0)
        return FALSE;

    /* parse the standard time name; if that's empty, fail */
    std_name = tz;
    tz = parse_zone_name(0, 0, tz, &len);
    if ((std_name_len = tz - std_name) == 0)
        return FALSE;

    /* parse the offset value */
    p = tz;
    if ((tz = parse_offset(&std_ofs, tz, &len)) == p)
        return FALSE;

    /* if we're using west-positive notation, convert to os_tzinfo_t specs */
    if (west_is_positive)
        std_ofs = -std_ofs;

    /* if we're not done, check for a daylight zone */
    p = tz;
    if (len != 0 && (tz = parse_zone_name(0, 0, tz, &len)) != p)
    {
        /* found a daylight zone name - note it */
        dst_name = p;
        dst_name_len = tz - p;
        
        /* 
         *   check for an optional offset value; if it's not present,
         *   daylight time is implicitly one hour ahead of standard time 
         */
        p = tz;
        if ((tz = parse_offset(&dst_ofs, tz, &len)) == p)
            dst_ofs = std_ofs + 60*60;
        else if (west_is_positive)
            dst_ofs = -dst_ofs;
    }
    else
    {
        /* there's no daylight zone, so just repeat the standard offset */
        dst_ofs = std_ofs;
    }

    /* check for the daylight time start/end dates */
    if (len != 0 && *tz == ',')
    {
        /* parse the start date */
        p = ++tz;
        --len;
        if ((tz = parse_dst_rule(&dst_start, tz, &len)) == p)
            return FALSE;

        /* if there's a start date, there has to be an end date */
        if (len == 0 || *tz != ',')
            return FALSE;

        /* parse the end date */
        p = ++tz;
        --len;
        if ((tz = parse_dst_rule(&dst_end, tz, &len)) == p)
            return FALSE;
    }
    
    /* we need to be done now, other than trailing spaces */
    for ( ; len != 0 && isspace(*tz) ; ++tz) ;
    if (len != 0)
        return FALSE;

    /* clear the result structure */
    memset(info, 0, sizeof(*info));

    /* set the offsets */
    info->std_ofs = std_ofs;
    info->dst_ofs = dst_ofs;

    /* copy the abbreviation strings */
    parse_zone_name(info->std_abbr, sizeof(info->std_abbr),
                    std_name, &std_name_len);
    parse_zone_name(info->dst_abbr, sizeof(info->dst_abbr),
                    dst_name, &dst_name_len);

    /* copy the daylight start/end rules */
    memcpy(&info->dst_start, &dst_start, sizeof(info->dst_start));
    memcpy(&info->dst_end, &dst_end, sizeof(info->dst_end));

    /* success */
    return TRUE;
}